

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::BindStaticResources
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,SHADER_TYPE ShaderStages,
          IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  PipelineResourceSignatureImplType *this_00;
  string _msg;
  
  CheckPipelineReady(this);
  if (this->m_UsingImplicitSignature != false) {
    this_00 = GetResourceSignature(this,0);
    PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::BindStaticResources
              (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
               ShaderStages,pResourceMapping,Flags);
    return;
  }
  FormatString<char[165]>
            (&_msg,(char (*) [165])
                   "IPipelineState::BindStaticResources is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::BindStaticResources instead."
            );
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&_msg);
  return;
}

Assistant:

BindStaticResources(SHADER_TYPE                 ShaderStages,
                                                        IResourceMapping*           pResourceMapping,
                                                        BIND_SHADER_RESOURCES_FLAGS Flags) override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::BindStaticResources is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::BindStaticResources instead.");
            return;
        }

        return this->GetResourceSignature(0)->BindStaticResources(ShaderStages, pResourceMapping, Flags);
    }